

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_metric_remove(nhdp_domain_metric *metric)

{
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_domain *domain;
  nhdp_domain_metric *metric_local;
  
  __tempptr = _domain_list.next + -0x2a;
  do {
    if (__tempptr[0x2a].prev == _domain_list.prev) {
LAB_00108704:
      avl_remove(&_domain_metrics,&metric->_node);
      return;
    }
    if ((nhdp_domain_metric *)__tempptr[2].next == metric) {
      _remove_metric((nhdp_domain *)__tempptr);
      goto LAB_00108704;
    }
    __tempptr = __tempptr[0x2a].next + -0x2a;
  } while( true );
}

Assistant:

void
nhdp_domain_metric_remove(struct nhdp_domain_metric *metric) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->metric == metric) {
      _remove_metric(domain);
      break;
    }
  }

  avl_remove(&_domain_metrics, &metric->_node);
}